

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

void N_VScale_Serial(realtype c,N_Vector x,N_Vector z)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  realtype *xd;
  realtype *zd;
  ulong uVar5;
  
  if (z == x) {
    uVar1 = *x->content;
    lVar2 = *(long *)((long)x->content + 8);
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      *(double *)(lVar2 + uVar5 * 8) = *(double *)(lVar2 + uVar5 * 8) * c;
    }
  }
  else if ((c != 1.0) || (NAN(c))) {
    uVar1 = *x->content;
    lVar2 = *(long *)((long)x->content + 8);
    lVar3 = *(long *)((long)z->content + 8);
    if ((c != -1.0) || (NAN(c))) {
      uVar5 = 0;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = uVar5;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        *(double *)(lVar3 + uVar5 * 8) = *(double *)(lVar2 + uVar5 * 8) * c;
      }
    }
    else {
      uVar5 = 0;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = uVar5;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        *(ulong *)(lVar3 + uVar5 * 8) = *(ulong *)(lVar2 + uVar5 * 8) ^ 0x8000000000000000;
      }
    }
  }
  else {
    uVar1 = *x->content;
    lVar2 = *(long *)((long)x->content + 8);
    lVar3 = *(long *)((long)z->content + 8);
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      *(undefined8 *)(lVar3 + uVar5 * 8) = *(undefined8 *)(lVar2 + uVar5 * 8);
    }
  }
  return;
}

Assistant:

void N_VScale_Serial(realtype c, N_Vector x, N_Vector z)
{
  sunindextype i, N;
  realtype *xd, *zd;

  xd = zd = NULL;

  if (z == x) {  /* BLAS usage: scale x <- cx */
    VScaleBy_Serial(c, x);
    return;
  }

  if (c == ONE) {
    VCopy_Serial(x, z);
  } else if (c == -ONE) {
    VNeg_Serial(x, z);
  } else {
    N  = NV_LENGTH_S(x);
    xd = NV_DATA_S(x);
    zd = NV_DATA_S(z);
    for (i = 0; i < N; i++)
      zd[i] = c*xd[i];
  }

  return;
}